

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O2

void __thiscall
cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(CoinSelectionOption *this)

{
  uint32_t uVar1;
  ConfidentialValue local_2c8;
  Script local_2a0;
  Script local_268;
  Script wpkh_script;
  ConfidentialTxOutReference txout;
  ConfidentialTxOut ctxout;
  
  std::__cxx11::string::string
            ((string *)&ctxout,"0014ffffffffffffffffffffffffffffffffffffffff",(allocator *)&txout);
  core::Script::Script(&wpkh_script,(string *)&ctxout);
  std::__cxx11::string::~string((string *)&ctxout);
  core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&txout);
  core::ConfidentialValue::ConfidentialValue(&local_2c8);
  core::ConfidentialTxOut::ConfidentialTxOut
            (&ctxout,&wpkh_script,(ConfidentialAssetId *)&txout,&local_2c8);
  core::ConfidentialValue::~ConfidentialValue(&local_2c8);
  core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&txout);
  core::ConfidentialTxOutReference::ConfidentialTxOutReference(&txout,&ctxout);
  uVar1 = core::ConfidentialTxOutReference::GetSerializeVsize
                    (&txout,true,this->exponent_,this->minimum_bits_,(uint32_t *)0x0,0);
  this->change_output_size_ = uVar1;
  core::Script::Script(&local_268);
  core::Script::Script(&local_2a0);
  uVar1 = core::ConfidentialTxIn::EstimateTxInVsize
                    (kP2wpkhAddress,&local_268,0,&local_2a0,false,false,false,(Script *)0x0,0,0x34,
                     (uint32_t *)0x0,0);
  this->change_spend_size_ = uVar1;
  core::Script::~Script(&local_2a0);
  core::Script::~Script(&local_268);
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&txout);
  core::ConfidentialTxOut::~ConfidentialTxOut(&ctxout);
  core::Script::~Script(&wpkh_script);
  return;
}

Assistant:

void CoinSelectionOption::InitializeConfidentialTxSizeInfo() {
  // wpkh想定
  Script wpkh_script("0014ffffffffffffffffffffffffffffffffffffffff");
  ConfidentialTxOut ctxout(
      wpkh_script, ConfidentialAssetId(), ConfidentialValue());
  ConfidentialTxOutReference txout(ctxout);
  change_output_size_ =
      txout.GetSerializeVsize(true, exponent_, minimum_bits_);
  change_spend_size_ = ConfidentialTxIn::EstimateTxInVsize(
      AddressType::kP2wpkhAddress, Script(), 0, Script(), false, false);
}